

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall
TimerManager::removeAgentsByReceiver(TimerManager *this,void *receiver,IEventDispatcher *dispatcher)

{
  uint i;
  ulong uVar1;
  AutoLock l;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mMutex);
  for (uVar1 = 0; uVar1 < (this->mTimers).mSize; uVar1 = uVar1 + 1) {
    Timer::removeAgentsByReceiver((this->mTimers).mData[uVar1],receiver,dispatcher);
  }
  AutoLock::~AutoLock(&AStack_38);
  return;
}

Assistant:

void TimerManager::removeAgentsByReceiver( void* receiver,
										   IEventDispatcher* dispatcher )
{
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeAgentsByReceiver(receiver, dispatcher);
	}
}